

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O0

spv_operand_type_t spvTakeFirstMatchableOperand(spv_operand_pattern_t *pattern)

{
  spv_operand_type_t type;
  bool bVar1;
  reference pvVar2;
  spv_operand_type_t result;
  spv_operand_pattern_t *pattern_local;
  
  bVar1 = std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::empty(pattern);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    do {
      pvVar2 = std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::back(pattern);
      type = *pvVar2;
      std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::pop_back(pattern);
      bVar1 = spvExpandOperandSequenceOnce(type,pattern);
    } while (bVar1);
    return type;
  }
  __assert_fail("!pattern->empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp"
                ,0x1f0,"spv_operand_type_t spvTakeFirstMatchableOperand(spv_operand_pattern_t *)");
}

Assistant:

spv_operand_type_t spvTakeFirstMatchableOperand(
    spv_operand_pattern_t* pattern) {
  assert(!pattern->empty());
  spv_operand_type_t result;
  do {
    result = pattern->back();
    pattern->pop_back();
  } while (spvExpandOperandSequenceOnce(result, pattern));
  return result;
}